

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O3

MasterLinkPtr __thiscall miniros::ServiceManager::getMasterLink(ServiceManager *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Internal *pIVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  MasterLinkPtr MVar3;
  MasterLinkPtr MVar4;
  
  in_RDI->internal_ =
       (Internal *)
       (this->master_link_).super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  pIVar2 = (Internal *)
           (this->master_link_).super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  in_RDI[1].internal_ = pIVar2;
  if (pIVar2 != (Internal *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1 = &(pIVar2->rpcManager).
                super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      MVar3.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      MVar3.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (MasterLinkPtr)
             MVar3.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1 = &(pIVar2->rpcManager).
              super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    UNLOCK();
  }
  MVar4.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  MVar4.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (MasterLinkPtr)MVar4.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MasterLinkPtr ServiceManager::getMasterLink() const
{
  return master_link_;
}